

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int duckdb_je_ctl_nametomib(tsd_t *tsd,char *name,size_t *mibp,size_t *miblenp)

{
  _Bool _Var1;
  int iVar2;
  
  if (ctl_initialized == '\0') {
    _Var1 = ctl_init(tsd);
    if (_Var1) {
      return 0xb;
    }
  }
  iVar2 = ctl_lookup((tsdn_t *)tsd,super_root_node,name,(ctl_named_node_t **)0x0,mibp,miblenp);
  return iVar2;
}

Assistant:

int
ctl_nametomib(tsd_t *tsd, const char *name, size_t *mibp, size_t *miblenp) {
	int ret;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	ret = ctl_lookup(tsd_tsdn(tsd), super_root_node, name, NULL, mibp,
	    miblenp);
label_return:
	return(ret);
}